

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XObjectContentContext.cpp
# Opt level: O0

void __thiscall FormImageWritingTask::~FormImageWritingTask(FormImageWritingTask *this)

{
  FormImageWritingTask *this_local;
  
  (this->super_IFormEndWritingTask)._vptr_IFormEndWritingTask =
       (_func_int **)&PTR__FormImageWritingTask_0054f910;
  PDFParsingOptions::~PDFParsingOptions(&this->mPDFParsingOptions);
  std::__cxx11::string::~string((string *)&this->mImagePath);
  IFormEndWritingTask::~IFormEndWritingTask(&this->super_IFormEndWritingTask);
  return;
}

Assistant:

virtual ~FormImageWritingTask(){}